

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Doctor.cpp
# Opt level: O1

void __thiscall
Doctor::Doctor(Doctor *this,string *id,string *name,string *last_Name,string *phone_number,
              string *user_name,string password,string age,string field,string day,string time,
              string visited_patients)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pcVar1;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar1 = (id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + id->_M_string_length);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + name->_M_string_length);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar1 = (last_Name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + last_Name->_M_string_length);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  pcVar1 = (phone_number->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar1,pcVar1 + phone_number->_M_string_length);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  pcVar1 = (user_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar1,pcVar1 + user_name->_M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_88 = user_name;
  local_80 = phone_number;
  local_78 = last_Name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,*(long *)password._M_dataplus._M_p,
             *(long *)(password._M_dataplus._M_p + 8) + *(long *)password._M_dataplus._M_p);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,*(long *)password._M_string_length,
             *(long *)(password._M_string_length + 8) + *(long *)password._M_string_length);
  Human::Human(&this->super_Human,&local_b0,&local_d0,&local_f0,&local_110,&local_130,&local_70,
               &local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  (this->Day)._M_dataplus._M_p = (pointer)&(this->Day).field_2;
  (this->Day)._M_string_length = 0;
  (this->Day).field_2._M_local_buf[0] = '\0';
  (this->Time)._M_dataplus._M_p = (pointer)&(this->Time).field_2;
  (this->Time)._M_string_length = 0;
  (this->Time).field_2._M_local_buf[0] = '\0';
  local_90 = &this->Field;
  (this->Field)._M_dataplus._M_p = (pointer)&(this->Field).field_2;
  (this->Field)._M_string_length = 0;
  (this->Field).field_2._M_local_buf[0] = '\0';
  (this->Visited_Patients)._M_dataplus._M_p = (pointer)&(this->Visited_Patients).field_2;
  (this->Visited_Patients)._M_string_length = 0;
  (this->Visited_Patients).field_2._M_local_buf[0] = '\0';
  this_00 = &this->doctor_all_ino;
  (this->doctor_all_ino).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->doctor_all_ino).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->doctor_all_ino).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)local_90);
  std::__cxx11::string::_M_assign((string *)&this->Day);
  std::__cxx11::string::_M_assign((string *)&this->Time);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,id);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)password._M_dataplus._M_p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)password._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)password.field_2._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)password.field_2._8_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)age._M_dataplus._M_p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)age._M_string_length);
  return;
}

Assistant:

Doctor::Doctor(string id, string name, string last_Name, string phone_number, string user_name, string password, string age, string field, string day, string time, string visited_patients)
    :Human{ id,name,last_Name,phone_number,user_name,password,age } {
    Field = field;
    Day = day;
    Time = time;
    doctor_all_ino.push_back(id);
    doctor_all_ino.push_back(name);
    doctor_all_ino.push_back(last_Name);
    doctor_all_ino.push_back(phone_number);
    doctor_all_ino.push_back(user_name);
    doctor_all_ino.push_back(password);
    doctor_all_ino.push_back(age);
    doctor_all_ino.push_back(field);
    doctor_all_ino.push_back(day);
    doctor_all_ino.push_back(time);
    doctor_all_ino.push_back(visited_patients);
}